

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wstring * __thiscall
fmt::v5::vformat_abi_cxx11_
          (wstring *__return_storage_ptr__,v5 *this,wstring_view format_str,wformat_args args)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_7f8;
  
  local_7f8.super_basic_buffer<wchar_t>.ptr_ = local_7f8.store_;
  local_7f8.super_basic_buffer<wchar_t>.size_ = 0;
  local_7f8.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_00150cb8;
  local_7f8.super_basic_buffer<wchar_t>.capacity_ = 500;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_7f8,this,format_str.data_,format_str.size_);
  to_string<wchar_t,500ul>(__return_storage_ptr__,(v5 *)&local_7f8,buf);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(&local_7f8);
  return __return_storage_ptr__;
}

Assistant:

inline std::wstring vformat(wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  vformat_to(buffer, format_str, args);
  return to_string(buffer);
}